

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,unsigned_long param,unsigned_long params,unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1_00;
  undefined1 local_78 [40];
  char *local_50;
  char local_40 [16];
  
  ExceptionFormatValue::ExceptionFormatValue
            ((ExceptionFormatValue *)(local_78 + 0x10),(int64_t)values);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_78 + 0x10));
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  params_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff78,*(long *)params_1,
             *(long *)(params_1 + 8) + *(long *)params_1);
  ConstructMessageRecursive<unsigned_long,unsigned_long,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,params,(unsigned_long)&stack0xffffffffffffff78,params_1_00);
  if (params_1_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78)
  {
    operator_delete(params_1_00);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}